

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Ant * __thiscall
Ant::updatePh(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
             vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
             vector<Gate,_std::allocator<Gate>_> *gates)

{
  vector<Gate,_std::allocator<Gate>_> *pvVar1;
  vector<Pheromone,_std::allocator<Pheromone>_> *this_00;
  bool bVar2;
  reference __a;
  reference __a_00;
  int *piVar3;
  pair<int,_int> local_c0;
  pair<int,_int> local_b8;
  vector<Wall,_std::allocator<Wall>_> *local_b0;
  double d;
  Pheromone *pher;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<Pheromone,_std::allocator<Pheromone>_> *__range1_2;
  Gate *gate;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Gate,_std::allocator<Gate>_> *__range1_1;
  Wall *wall;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Wall,_std::allocator<Wall>_> *__range1;
  double bestDist;
  Pheromone target;
  int rightBound;
  int leftBound;
  int lowerBound;
  int upperBound;
  vector<Gate,_std::allocator<Gate>_> *gates_local;
  vector<Pheromone,_std::allocator<Pheromone>_> *pheromones_local;
  vector<Wall,_std::allocator<Wall>_> *walls_local;
  Ant *this_local;
  
  leftBound = -999999;
  rightBound = 999999;
  target.y = -999999;
  target.x = 999999;
  _lowerBound = gates;
  gates_local = (vector<Gate,_std::allocator<Gate>_> *)pheromones;
  pheromones_local = (vector<Pheromone,_std::allocator<Pheromone>_> *)walls;
  walls_local = (vector<Wall,_std::allocator<Wall>_> *)this;
  Pheromone::Pheromone((Pheromone *)&bestDist,this->x + -1,this->y);
  this_00 = pheromones_local;
  __range1 = (vector<Wall,_std::allocator<Wall>_> *)0x412e847e00000000;
  __end1 = std::vector<Wall,_std::allocator<Wall>_>::begin
                     ((vector<Wall,_std::allocator<Wall>_> *)pheromones_local);
  wall = (Wall *)std::vector<Wall,_std::allocator<Wall>_>::end
                           ((vector<Wall,_std::allocator<Wall>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator==<const_Wall_*,_std::vector<Wall,_std::allocator<Wall>_>_>
                           (&__end1,(__normal_iterator<const_Wall_*,_std::vector<Wall,_std::allocator<Wall>_>_>
                                     *)&wall), pvVar1 = _lowerBound, ((bVar2 ^ 0xffU) & 1) != 0) {
    __a = __gnu_cxx::__normal_iterator<const_Wall_*,_std::vector<Wall,_std::allocator<Wall>_>_>::
          operator*(&__end1);
    if (__a->x == this->x) {
      if (this->y < __a->y) {
        piVar3 = std::min<int>(&__a->y,&rightBound);
        rightBound = *piVar3;
      }
      else if (__a->y < this->y) {
        piVar3 = std::max<int>(&__a->y,&leftBound);
        leftBound = *piVar3;
      }
    }
    else if (__a->y == this->y) {
      if (this->x < __a->x) {
        piVar3 = std::min<int>(&__a->x,&target.x);
        target.x = *piVar3;
      }
      else if (__a->x < this->x) {
        piVar3 = std::max<int>(&__a->x,&target.y);
        target.y = *piVar3;
      }
    }
    __gnu_cxx::__normal_iterator<const_Wall_*,_std::vector<Wall,_std::allocator<Wall>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<Gate,_std::allocator<Gate>_>::begin(_lowerBound);
  gate = (Gate *)std::vector<Gate,_std::allocator<Gate>_>::end(pvVar1);
  while (bVar2 = __gnu_cxx::operator==<const_Gate_*,_std::vector<Gate,_std::allocator<Gate>_>_>
                           (&__end1_1,
                            (__normal_iterator<const_Gate_*,_std::vector<Gate,_std::allocator<Gate>_>_>
                             *)&gate), pvVar1 = gates_local, ((bVar2 ^ 0xffU) & 1) != 0) {
    __a_00 = __gnu_cxx::__normal_iterator<const_Gate_*,_std::vector<Gate,_std::allocator<Gate>_>_>::
             operator*(&__end1_1);
    if (__a_00->x == this->x) {
      if ((this->y < __a_00->y) && (__a_00->facing == 1)) {
        piVar3 = std::min<int>(&__a_00->y,&rightBound);
        rightBound = *piVar3;
      }
      else if ((__a_00->y < this->y) && (__a_00->facing == 3)) {
        piVar3 = std::max<int>(&__a_00->y,&leftBound);
        leftBound = *piVar3;
      }
    }
    else if (__a_00->y == this->y) {
      if ((this->x < __a_00->x) && (__a_00->facing == 0)) {
        piVar3 = std::min<int>(&__a_00->x,&target.x);
        target.x = *piVar3;
      }
      else if ((__a_00->x < this->x) && (__a_00->facing == 2)) {
        piVar3 = std::max<int>(&__a_00->x,&target.y);
        target.y = *piVar3;
      }
    }
    __gnu_cxx::__normal_iterator<const_Gate_*,_std::vector<Gate,_std::allocator<Gate>_>_>::
    operator++(&__end1_1);
  }
  __end1_2 = std::vector<Pheromone,_std::allocator<Pheromone>_>::begin
                       ((vector<Pheromone,_std::allocator<Pheromone>_> *)gates_local);
  pher = (Pheromone *)
         std::vector<Pheromone,_std::allocator<Pheromone>_>::end
                   ((vector<Pheromone,_std::allocator<Pheromone>_> *)pvVar1);
  while (bVar2 = __gnu_cxx::
                 operator==<const_Pheromone_*,_std::vector<Pheromone,_std::allocator<Pheromone>_>_>
                           (&__end1_2,
                            (__normal_iterator<const_Pheromone_*,_std::vector<Pheromone,_std::allocator<Pheromone>_>_>
                             *)&pher), ((bVar2 ^ 0xffU) & 1) != 0) {
    d = (double)__gnu_cxx::
                __normal_iterator<const_Pheromone_*,_std::vector<Pheromone,_std::allocator<Pheromone>_>_>
                ::operator*(&__end1_2);
    std::pair<int,_int>::pair<int,_int,_true>(&local_b8,(int *)d,&((reference)d)->y);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_c0,&this->x,&this->y);
    local_b0 = (vector<Wall,_std::allocator<Wall>_> *)dist(&local_b8,&local_c0);
    if (((((0.0 < (double)local_b0) && ((double)local_b0 < (double)__range1)) &&
         (leftBound < *(int *)((long)d + 4))) &&
        ((*(int *)((long)d + 4) < rightBound && (target.y < *(int *)d)))) && (*(int *)d < target.x))
    {
      bestDist = *(double *)d;
      __range1 = local_b0;
    }
    __gnu_cxx::
    __normal_iterator<const_Pheromone_*,_std::vector<Pheromone,_std::allocator<Pheromone>_>_>::
    operator++(&__end1_2);
  }
  this->t = (Pheromone)bestDist;
  if (bestDist._0_4_ < this->x) {
    setFacing(this,0);
  }
  else if (bestDist._4_4_ < this->y) {
    setFacing(this,1);
  }
  else if (this->x < bestDist._0_4_) {
    setFacing(this,2);
  }
  else if (this->y < bestDist._4_4_) {
    setFacing(this,3);
  }
  return this;
}

Assistant:

Ant& updatePh(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            int upperBound = -999999; int lowerBound = 999999;
            int leftBound = -999999; int rightBound = 999999;

            Pheromone target(x - 1, y);
            double bestDist = 999999;

            for (const Wall & wall : walls) {
                if (wall.x == x) {
                    if (wall.y > y)
                        lowerBound = min(wall.y, lowerBound);
                    else if (wall.y < y)
                        upperBound = max(wall.y, upperBound);
                } else if (wall.y == y) {
                    if (wall.x > x)
                        rightBound = min(wall.x, rightBound);
                    else if (wall.x < x)
                        leftBound = max(wall.x, leftBound);
                }
            }

            for (const Gate & gate : gates) {
                if (gate.x == x) {
                    if (gate.y > y && gate.facing == 1)
                        lowerBound = min(gate.y, lowerBound);
                    else if (gate.y < y && gate.facing == 3)
                        upperBound = max(gate.y, upperBound);
                } else if (gate.y == y) {
                    if (gate.x > x && gate.facing == 0)
                        rightBound = min(gate.x, rightBound);
                    else if (gate.x < x && gate.facing == 2)
                        leftBound = max(gate.x, leftBound);
                }
            }

            for (const Pheromone & pher : pheromones) {
                double d = dist({ pher.x, pher.y }, { x, y });
                if (0 < d && d < bestDist &&
                        upperBound < pher.y && pher.y < lowerBound &&
                        leftBound < pher.x && pher.x < rightBound) {
                    bestDist = d;
                    target = pher;
                }
            }

            this -> t = target;

            if (target.x < x)
                setFacing(0);
            else if (target.y < y)
                setFacing(1);
            else if (x < target.x)
                setFacing(2);
            else if (y < target.y)
                setFacing(3);

            return *this;
        }